

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

string * deqp::gls::ShaderExecUtil::generatePassthroughFragmentShader
                   (string *__return_storage_ptr__,ShaderSpec *shaderSpec,bool useIntOutputs,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *outLocationMap,string *inputPrefix,string *outputPrefix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_type sVar1;
  bool useIntOutputs_00;
  string *outputPrefix_00;
  string *psVar2;
  int vecSize;
  DataType DVar3;
  char *__s;
  size_t sVar4;
  ostream *poVar5;
  undefined7 in_register_00000011;
  VarType *varType_;
  pointer pSVar6;
  VarType intType;
  ostringstream src;
  string *local_248;
  undefined4 local_23c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_218;
  string *local_210;
  string *local_208;
  VarType local_200;
  DeclareVariable local_1e8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_23c = (undefined4)CONCAT71(in_register_00000011,useIntOutputs);
  local_248 = inputPrefix;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = glu::getGLSLVersionDeclaration(shaderSpec->version);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_248 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xa0);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  sVar1 = (shaderSpec->globalDeclarations)._M_string_length;
  if (sVar1 != 0) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(shaderSpec->globalDeclarations)._M_dataplus._M_p,sVar1
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  pSVar6 = (shaderSpec->outputs).
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_218 = outLocationMap;
  local_210 = outputPrefix;
  local_208 = __return_storage_ptr__;
  if (pSVar6 != (shaderSpec->outputs).
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    varType_ = &pSVar6->varType;
    do {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&varType_[-2].m_data + 8);
      DVar3 = (varType_->m_data).basic.type;
      if (DVar3 - TYPE_BOOL < 4) {
        vecSize = glu::getDataTypeScalarSize(DVar3);
        DVar3 = TYPE_INT;
        if (1 < vecSize) {
          DVar3 = glu::getDataTypeIntVec(vecSize);
        }
        glu::VarType::VarType(&local_200,DVar3,PRECISION_HIGHP);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"flat in ",8);
        std::operator+(&local_238,local_248,__rhs);
        glu::decl::DeclareVariable::DeclareVariable(&local_1e8,&local_200,&local_238,0);
        poVar5 = glu::decl::operator<<((ostream *)local_1a8,&local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
          operator_delete(local_1e8.name._M_dataplus._M_p,
                          local_1e8.name.field_2._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType(&local_1e8.varType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType(&local_200);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"flat in ",8);
        std::operator+(&local_238,local_248,__rhs);
        glu::decl::DeclareVariable::DeclareVariable(&local_1e8,varType_,&local_238,0);
        poVar5 = glu::decl::operator<<((ostream *)local_1a8,&local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
          operator_delete(local_1e8.name._M_dataplus._M_p,
                          local_1e8.name.field_2._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType(&local_1e8.varType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
      }
      pSVar6 = (pointer)(varType_ + 1);
      varType_ = (VarType *)&varType_[2].m_data;
    } while (pSVar6 != (shaderSpec->outputs).
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  outputPrefix_00 = local_210;
  useIntOutputs_00 = local_23c._0_1_;
  generateFragShaderOutputDecl((ostream *)local_1a8,shaderSpec,local_23c._0_1_,local_218,local_210);
  psVar2 = local_208;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nvoid main (void)\n{\n",0x14);
  generateFragShaderOutAssign
            ((ostream *)local_1a8,shaderSpec,useIntOutputs_00,local_248,outputPrefix_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string generatePassthroughFragmentShader (const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& inputPrefix, const std::string& outputPrefix)
{
	DE_ASSERT(glu::glslVersionUsesInOutQualifiers(shaderSpec.version));

	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType		intType		(intBaseType, glu::PRECISION_HIGHP);

			src << "flat in " << glu::declare(intType, inputPrefix + output->name) << ";\n";
		}
		else
			src << "flat in " << glu::declare(output->varType, inputPrefix + output->name) << ";\n";
	}

	generateFragShaderOutputDecl(src, shaderSpec, useIntOutputs, outLocationMap, outputPrefix);

	src << "\nvoid main (void)\n{\n";

	generateFragShaderOutAssign(src, shaderSpec, useIntOutputs, inputPrefix, outputPrefix);

	src << "}\n";

	return src.str();
}